

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.h
# Opt level: O0

BayesianProbitRegressor_Gaussian * __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::mutable_featureweight
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor_FeatureValueWeight *this_local;
  
  if (this->featureweight_ == (BayesianProbitRegressor_Gaussian *)0x0) {
    this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00);
    this->featureweight_ = this_00;
  }
  return this->featureweight_;
}

Assistant:

inline ::CoreML::Specification::BayesianProbitRegressor_Gaussian* BayesianProbitRegressor_FeatureValueWeight::mutable_featureweight() {
  
  if (featureweight_ == NULL) {
    featureweight_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight.featureWeight)
  return featureweight_;
}